

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

void __thiscall
kratos::SystemVerilogCodeGen::generate_interface(SystemVerilogCodeGen *this,Generator *generator)

{
  StatementType SVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *this_00;
  element_type *stmt_00;
  undefined1 local_58 [8];
  shared_ptr<kratos::InterfaceInstantiationStmt> s;
  undefined1 local_38 [8];
  shared_ptr<kratos::Stmt> stmt;
  uint64_t i;
  uint64_t stmt_count;
  Generator *generator_local;
  SystemVerilogCodeGen *this_local;
  
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Generator::stmts_count(generator);
  for (stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi < p_Var2;
      stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi)->_vptr__Sp_counted_base + 1)) {
    Generator::get_stmt((Generator *)local_38,(uint32_t)generator);
    this_00 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_38);
    SVar1 = Stmt::type(this_00);
    if (SVar1 == InterfaceInstantiation) {
      std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 local_38);
      Stmt::as<kratos::InterfaceInstantiationStmt>((Stmt *)local_58);
      stmt_00 = std::__shared_ptr<kratos::InterfaceInstantiationStmt,_(__gnu_cxx::_Lock_policy)2>::
                get((__shared_ptr<kratos::InterfaceInstantiationStmt,_(__gnu_cxx::_Lock_policy)2> *)
                    local_58);
      stmt_code(this,stmt_00);
      std::shared_ptr<kratos::InterfaceInstantiationStmt>::~shared_ptr
                ((shared_ptr<kratos::InterfaceInstantiationStmt> *)local_58);
    }
    std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)local_38);
  }
  return;
}

Assistant:

void SystemVerilogCodeGen::generate_interface(Generator* generator) {
    uint64_t stmt_count = generator->stmts_count();
    for (uint64_t i = 0; i < stmt_count; i++) {
        auto stmt = generator->get_stmt(i);
        if (stmt->type() == StatementType::InterfaceInstantiation) {
            auto s = stmt->as<InterfaceInstantiationStmt>();
            stmt_code(s.get());
        }
    }
}